

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

QMultiHash<QByteArray,_QByteArray> * __thiscall
QMultiHash<QByteArray,_QByteArray>::unite
          (QMultiHash<QByteArray,_QByteArray> *this,QHash<QByteArray,_QByteArray> *other)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  iterator iStack_48;
  piter local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = (piter)QHash<QByteArray,_QByteArray>::cbegin(other);
  while( true ) {
    if (local_30.d == (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0 &&
        local_30.bucket == 0) break;
    pSVar2 = (local_30.d)->spans;
    uVar4 = local_30.bucket >> 7;
    pEVar3 = pSVar2[uVar4].entries;
    bVar1 = pSVar2[uVar4].offsets[(uint)local_30.bucket & 0x7f];
    QMultiHash<QByteArray,QByteArray>::emplace<QByteArray_const&>
              (&iStack_48,this,(QByteArray *)(pEVar3 + bVar1),
               (QByteArray *)(pEVar3[bVar1].storage.data + 0x18));
    QHashPrivate::iterator<QHashPrivate::Node<QByteArray,_QByteArray>_>::operator++(&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QMultiHash &unite(const QHash<Key, T> &other)
    {
        for (auto cit = other.cbegin(); cit != other.cend(); ++cit)
            insert(cit.key(), *cit);
        return *this;
    }